

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O3

char * filter_escapes(char *str)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  char cVar5;
  long *plVar6;
  long *plVar7;
  int iVar8;
  undefined8 uVar9;
  char *pcVar10;
  
  if ((str == (char *)0x0) || (*str == '\0')) {
    g_return_if_fail_warning("rifiuti2","filter_escapes","(str != NULL) && (*str != \'\\0\')");
    return (char *)0x0;
  }
  plVar6 = (long *)g_string_new(0);
  cVar5 = *str;
  do {
    if (cVar5 == '\\') {
      pcVar10 = str + 1;
      bVar2 = str[1];
      lVar3 = plVar6[1];
      uVar4 = plVar6[2];
      uVar1 = lVar3 + 1;
      if (bVar2 < 0x72) {
        if (bVar2 == 0x65) {
          if (uVar1 < uVar4) {
            plVar6[1] = uVar1;
            *(undefined1 *)(*plVar6 + lVar3) = 0x1b;
LAB_00106550:
            *(undefined1 *)(*plVar6 + plVar6[1]) = 0;
            goto LAB_001065b8;
          }
          uVar9 = 0x1b;
        }
        else {
          if (bVar2 != 0x6e) {
LAB_0010651c:
            if (uVar4 <= uVar1) {
              iVar8 = 0x5c;
              goto LAB_00106512;
            }
            plVar6[1] = uVar1;
            *(undefined1 *)(*plVar6 + lVar3) = 0x5c;
            goto LAB_001064d5;
          }
          if (uVar1 < uVar4) {
            plVar6[1] = uVar1;
            *(undefined1 *)(*plVar6 + lVar3) = 10;
            goto LAB_00106550;
          }
          uVar9 = 10;
        }
      }
      else if (bVar2 == 0x74) {
        if (uVar1 < uVar4) {
          plVar6[1] = uVar1;
          *(undefined1 *)(*plVar6 + lVar3) = 9;
          goto LAB_00106550;
        }
        uVar9 = 9;
      }
      else {
        if (bVar2 != 0x72) goto LAB_0010651c;
        if (uVar1 < uVar4) {
          plVar6[1] = uVar1;
          *(undefined1 *)(*plVar6 + lVar3) = 0xd;
          goto LAB_00106550;
        }
        uVar9 = 0xd;
      }
      g_string_insert_c(plVar6,0xffffffffffffffff,uVar9);
    }
    else {
      lVar3 = plVar6[1];
      uVar1 = lVar3 + 1;
      if (uVar1 < (ulong)plVar6[2]) {
        plVar6[1] = uVar1;
        *(char *)(*plVar6 + lVar3) = cVar5;
LAB_001064d5:
        *(undefined1 *)(*plVar6 + plVar6[1]) = 0;
        pcVar10 = str;
      }
      else {
        iVar8 = (int)cVar5;
LAB_00106512:
        g_string_insert_c(plVar6,0xffffffffffffffff,iVar8);
        pcVar10 = str;
      }
    }
LAB_001065b8:
    cVar5 = pcVar10[1];
    str = pcVar10 + 1;
    if (cVar5 == '\0') {
      plVar7 = (long *)g_string_new("filtered delimiter = ");
      pcVar10 = (char *)*plVar6;
      cVar5 = *pcVar10;
      do {
        pcVar10 = pcVar10 + 1;
        if ((byte)(cVar5 + 0x81U) < 0xa1) {
          g_string_append_printf(plVar7,"\\x%02X",cVar5);
        }
        else {
          lVar3 = plVar7[1];
          uVar1 = lVar3 + 1;
          if (uVar1 < (ulong)plVar7[2]) {
            plVar7[1] = uVar1;
            *(char *)(*plVar7 + lVar3) = cVar5;
            *(undefined1 *)(*plVar7 + plVar7[1]) = 0;
          }
          else {
            g_string_insert_c(plVar7,0xffffffffffffffff,(int)cVar5);
          }
        }
        cVar5 = *pcVar10;
      } while (cVar5 != '\0');
      g_log("rifiuti2",0x80,"%s",*plVar7);
      g_string_free(plVar7,1);
      pcVar10 = (char *)g_string_free(plVar6,0);
      return pcVar10;
    }
  } while( true );
}

Assistant:

char *
filter_escapes (const char *str)
{
    GString *result, *debug_str;
    char *i = (char *) str;

    g_return_val_if_fail ( (str != NULL) && (*str != '\0'), NULL);

    result = g_string_new (NULL);
    do
    {
        if ( *i != '\\' )
        {
            result = g_string_append_c (result, *i);
            continue;
        }

        switch ( *(++i) )
        {
          case 'r':
            result = g_string_append_c (result, '\r'); break;
          case 'n':
            result = g_string_append_c (result, '\n'); break;
          case 't':
            result = g_string_append_c (result, '\t'); break;
          case 'e':
            result = g_string_append_c (result, '\x1B'); break;
          default:
            result = g_string_append_c (result, '\\'); i--;
        }
    }
    while ( *(++i) );

    debug_str = g_string_new ("filtered delimiter = ");
    i = result->str;
    do
    {
        if ( *i >= 0x20 && *i <= 0x7E )  /* problem during linking with g_ascii_isprint */
            debug_str = g_string_append_c (debug_str, *i);
        else
            g_string_append_printf (debug_str, "\\x%02X", *(unsigned char *) i);
    }
    while ( *(++i) );
    g_debug ("%s", debug_str->str);
    g_string_free (debug_str, TRUE);
    return g_string_free (result, FALSE);
}